

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::split_node
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint index)

{
  uint *puVar1;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  void *pvVar7;
  void *p;
  char cVar8;
  uint i;
  long lVar9;
  vq_node *pvVar10;
  uint uVar11;
  uint i_8;
  ulong uVar12;
  ulong uVar13;
  uint min_new_capacity;
  ulong uVar14;
  vq_node *pvVar15;
  ulong uVar16;
  float dist2;
  float fVar17;
  float dist2_1;
  float fVar18;
  float fVar19;
  float fVar20;
  vec<2U,_float> new_right_child;
  vec<2U,_float> new_left_child;
  vec<2U,_float> right_child;
  vec<2U,_float> left_child;
  vec<2U,_float> result;
  float local_a8 [2];
  float local_a0 [2];
  float local_98;
  float local_94;
  double local_90;
  double local_88;
  undefined1 local_80 [8];
  undefined1 local_78 [12];
  float local_6c;
  clusterizer<crnlib::vec<2U,_float>_> *local_68;
  uint local_60;
  uint local_5c;
  float afStack_58 [2];
  elemental_vector *local_50;
  vq_node *local_48;
  elemental_vector *local_40;
  elemental_vector *local_38;
  
  pvVar15 = (this->m_nodes).m_p;
  if (pvVar15[index].m_vectors.m_size != 1) {
    pvVar15 = pvVar15 + index;
    if (this->m_quick == true) {
      compute_split_estimate(this,(vec<2U,_float> *)local_78,(vec<2U,_float> *)local_80,pvVar15);
    }
    else {
      compute_split_pca(this,(vec<2U,_float> *)local_78,(vec<2U,_float> *)local_80,pvVar15);
    }
    local_50 = (elemental_vector *)&this->m_nodes;
    local_60 = 8;
    if (this->m_quick != false) {
      local_60 = 2;
    }
    local_38 = (elemental_vector *)&this->m_left_children;
    local_40 = (elemental_vector *)&this->m_right_children;
    local_94 = 0.0;
    local_6c = 1e+10;
    local_98 = 0.0;
    uVar11 = 0;
    local_68 = this;
    local_48 = pvVar15;
    do {
      if ((this->m_left_children).m_size != 0) {
        (this->m_left_children).m_size = 0;
      }
      if ((this->m_right_children).m_size != 0) {
        (this->m_right_children).m_size = 0;
      }
      local_a0[0] = 0.0;
      local_a0[1] = 0.0;
      local_a8[0] = 0.0;
      local_a8[1] = 0.0;
      local_5c = uVar11;
      if ((pvVar15->m_vectors).m_size == 0) {
        local_88 = 0.0;
        local_90 = 0.0;
        uVar12 = 0;
        uVar13 = 0;
      }
      else {
        local_90 = 0.0;
        uVar14 = 0;
        uVar13 = 0;
        uVar12 = 0;
        local_88 = 0.0;
        do {
          puVar6 = (pvVar15->m_vectors).m_p;
          ppVar2 = (this->m_training_vecs).m_p + puVar6[uVar14];
          uVar16 = (ulong)ppVar2->second;
          fVar17 = 0.0;
          lVar9 = 0;
          do {
            fVar18 = *(float *)(local_78 + lVar9 * 4) - (ppVar2->first).m_s[lVar9];
            fVar17 = fVar17 + fVar18 * fVar18;
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          fVar18 = 0.0;
          lVar9 = 0;
          do {
            fVar19 = *(float *)(local_80 + lVar9 * 4) - (ppVar2->first).m_s[lVar9];
            fVar18 = fVar18 + fVar19 * fVar19;
            lVar9 = lVar9 + 1;
          } while (lVar9 == 1);
          if (fVar18 <= fVar17) {
            uVar4 = (this->m_right_children).m_size;
            if ((this->m_right_children).m_capacity <= uVar4) {
              elemental_vector::increase_capacity(local_40,uVar4 + 1,true,4,(object_mover)0x0,false)
              ;
              this = local_68;
              pvVar15 = local_48;
            }
            (this->m_right_children).m_p[(this->m_right_children).m_size] = puVar6[uVar14];
            puVar1 = &(this->m_right_children).m_size;
            *puVar1 = *puVar1 + 1;
            lVar9 = 0;
            do {
              afStack_58[lVar9] = (ppVar2->first).m_s[lVar9] * (float)uVar16;
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            lVar9 = 0;
            do {
              local_a8[lVar9] = afStack_58[lVar9] + local_a8[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            uVar12 = uVar12 + uVar16;
            fVar17 = (ppVar2->first).m_s[0];
            fVar18 = (ppVar2->first).m_s[1];
            local_88 = local_88 + (double)((fVar18 * fVar18 + fVar17 * fVar17) * (float)uVar16);
          }
          else {
            uVar4 = (this->m_left_children).m_size;
            if ((this->m_left_children).m_capacity <= uVar4) {
              elemental_vector::increase_capacity(local_38,uVar4 + 1,true,4,(object_mover)0x0,false)
              ;
              this = local_68;
              pvVar15 = local_48;
            }
            (this->m_left_children).m_p[(this->m_left_children).m_size] = puVar6[uVar14];
            puVar1 = &(this->m_left_children).m_size;
            *puVar1 = *puVar1 + 1;
            lVar9 = 0;
            do {
              afStack_58[lVar9] = (ppVar2->first).m_s[lVar9] * (float)uVar16;
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            lVar9 = 0;
            do {
              local_a0[lVar9] = afStack_58[lVar9] + local_a0[lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            uVar13 = uVar13 + uVar16;
            fVar17 = (ppVar2->first).m_s[0];
            fVar18 = (ppVar2->first).m_s[1];
            local_90 = local_90 + (double)((fVar18 * fVar18 + fVar17 * fVar17) * (float)uVar16);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (pvVar15->m_vectors).m_size);
      }
      if (uVar13 == 0 || uVar12 == 0) {
        pvVar15->m_unsplittable = true;
        cVar8 = '\x01';
      }
      else {
        fVar17 = local_a0[0] * local_a0[0];
        fVar19 = local_a0[1] * local_a0[1];
        fVar18 = local_a8[0] * local_a8[0];
        fVar20 = local_a8[1] * local_a8[1];
        lVar9 = 0;
        do {
          local_a0[lVar9] = local_a0[lVar9] * (1.0 / (float)uVar13);
          lVar9 = lVar9 + 1;
        } while (lVar9 == 1);
        local_94 = (float)(local_90 - (double)((fVar19 + fVar17) / (float)uVar13));
        lVar9 = 0;
        do {
          local_a8[lVar9] = local_a8[lVar9] * (1.0 / (float)uVar12);
          lVar9 = lVar9 + 1;
        } while (lVar9 == 1);
        local_78._0_4_ = local_a0[0];
        local_78._4_4_ = local_a0[1];
        local_80._0_4_ = local_a8[0];
        local_80._4_4_ = local_a8[1];
        local_98 = (float)(local_88 - (double)((fVar20 + fVar18) / (float)uVar12));
        fVar17 = local_94 + local_98;
        cVar8 = '\x02';
        if (1e-05 <= fVar17) {
          fVar18 = (local_6c - fVar17) / fVar17;
          if (0.00125 <= fVar18) {
            local_6c = fVar17;
          }
          cVar8 = (fVar18 < 0.00125) * '\x02';
        }
      }
      if (cVar8 != '\0') goto LAB_00143123;
      uVar11 = local_5c + 1;
    } while (uVar11 != local_60);
    cVar8 = '\x02';
LAB_00143123:
    if (cVar8 == '\x02') {
      uVar4 = (this->m_nodes).m_size;
      pvVar15->m_left = uVar4;
      pvVar15->m_right = uVar4 + 1;
      uVar11 = this->m_split_index;
      min_new_capacity = uVar4 + 2;
      pvVar15->m_codebook_index = uVar11;
      this->m_split_index = uVar11 + 1;
      local_68 = (clusterizer<crnlib::vec<2U,_float>_> *)CONCAT44(local_68._4_4_,uVar4 + 1);
      local_90 = (double)uVar13;
      local_88 = (double)uVar12;
      if (uVar4 >> 1 < 0x7fffffff) {
        if ((this->m_nodes).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    (local_50,min_new_capacity,false,0x38,
                     vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,
                     false);
        }
        uVar5 = (this->m_nodes).m_size;
        if (min_new_capacity - uVar5 != 0) {
          pvVar15 = (this->m_nodes).m_p;
          lVar9 = 0;
          do {
            puVar3 = (undefined8 *)
                     ((long)&((vector<unsigned_int> *)(&pvVar15[uVar5].m_centroid + 3))->m_p + lVar9
                     );
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)pvVar15[uVar5].m_centroid.m_s + lVar9);
            *puVar3 = 0;
            puVar3[1] = 0;
            *(undefined8 *)((long)(&pvVar15[uVar5].m_centroid + 5) + lVar9) = 0xffffffffffffffff;
            *(undefined4 *)((long)(&pvVar15[uVar5].m_centroid + 6) + lVar9) = 0xffffffff;
            *(undefined1 *)((long)(&pvVar15[uVar5].m_centroid + 6) + lVar9 + 4) = 0;
            lVar9 = lVar9 + 0x38;
          } while ((ulong)(min_new_capacity - uVar5) * 0x38 - lVar9 != 0);
        }
      }
      else {
        pvVar7 = local_50->m_p;
        lVar9 = 0;
        do {
          p = *(void **)((long)pvVar7 + lVar9 + (ulong)min_new_capacity * 0x38 + 0x18);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar9 = lVar9 + 0x38;
        } while (lVar9 != 0x37ffffff90);
      }
      (this->m_nodes).m_size = min_new_capacity;
      pvVar15 = (this->m_nodes).m_p;
      pvVar10 = pvVar15 + uVar4;
      fVar17 = local_68._0_4_;
      if (pvVar10 != (vq_node *)local_78) {
        lVar9 = 0;
        do {
          (pvVar10->m_centroid).m_s[lVar9] = *(float *)(local_78 + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 == 1);
      }
      pvVar15 = pvVar15 + ((ulong)local_68 & 0xffffffff);
      pvVar10->m_total_weight = (uint64)local_90;
      puVar6 = (pvVar10->m_vectors).m_p;
      (pvVar10->m_vectors).m_p = (this->m_left_children).m_p;
      (this->m_left_children).m_p = puVar6;
      uVar11 = (pvVar10->m_vectors).m_size;
      (pvVar10->m_vectors).m_size = (this->m_left_children).m_size;
      (this->m_left_children).m_size = uVar11;
      uVar11 = (pvVar10->m_vectors).m_capacity;
      (pvVar10->m_vectors).m_capacity = (this->m_left_children).m_capacity;
      (this->m_left_children).m_capacity = uVar11;
      pvVar10->m_variance = local_94;
      if ((1 < (pvVar10->m_vectors).m_size) && (0.0 < local_94)) {
        insert_heap(this,uVar4);
      }
      if (pvVar15 != (vq_node *)local_80) {
        lVar9 = 0;
        do {
          (pvVar15->m_centroid).m_s[lVar9] = *(float *)(local_80 + lVar9 * 4);
          lVar9 = lVar9 + 1;
        } while (lVar9 == 1);
      }
      pvVar15->m_total_weight = (uint64)local_88;
      puVar6 = (pvVar15->m_vectors).m_p;
      (pvVar15->m_vectors).m_p = (this->m_right_children).m_p;
      (this->m_right_children).m_p = puVar6;
      uVar11 = (pvVar15->m_vectors).m_size;
      (pvVar15->m_vectors).m_size = (this->m_right_children).m_size;
      (this->m_right_children).m_size = uVar11;
      uVar11 = (pvVar15->m_vectors).m_capacity;
      (pvVar15->m_vectors).m_capacity = (this->m_right_children).m_capacity;
      (this->m_right_children).m_capacity = uVar11;
      pvVar15->m_variance = local_98;
      if ((1 < (pvVar15->m_vectors).m_size) && (0.0 < local_98)) {
        insert_heap(this,(uint)fVar17);
      }
    }
  }
  return;
}

Assistant:

training_vec_array& get_training_vecs()
        {
            return m_training_vecs;
        }